

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_half.h.c
# Opt level: O0

int test_half_to_float(cl_half h,cl_float ref)

{
  cl_float cVar1;
  FI ref_i;
  FI f_i;
  cl_float f;
  cl_float ref_local;
  cl_half h_local;
  
  cVar1 = cl_half_to_float(h);
  if ((cVar1 != ref) || (NAN(cVar1) || NAN(ref))) {
    printf("\nERROR: converting 0x%04x to float: expected 0x%08x, got 0x%08x\n",(ulong)h,
           (ulong)(uint)ref,(ulong)(uint)cVar1);
    ref_local = 0.0;
  }
  else {
    ref_local = 1.4013e-45;
  }
  return (int)ref_local;
}

Assistant:

int test_half_to_float(cl_half h, cl_float ref)
{
  cl_float f = cl_half_to_float(h);
  if (f != ref) {
    union FI f_i, ref_i;
    f_i.f = f;
    ref_i.f = ref;
    printf("\nERROR: converting 0x%04x to float: expected 0x%08x, got 0x%08x\n",
           h, ref_i.i, f_i.i);
    return 0;
  }
  return 1;
}